

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_mesh.c
# Opt level: O1

void build_bvh_tree(BVHNode *bvh_root,TriangleMesh *mesh,Centroid *centroids_by_x,
                   Centroid *centroids_by_y,Centroid *centroids_by_z,uint depth,
                   Triangle *new_triangles)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  Triangle *pTVar4;
  size_t sVar5;
  int iVar6;
  undefined8 *__ptr;
  void *pvVar7;
  long lVar8;
  void *pvVar9;
  void *pvVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  size_t sVar13;
  ulong uVar14;
  long lVar15;
  undefined4 *puVar16;
  uint uVar17;
  undefined4 *puVar18;
  Centroid *pCVar19;
  size_t *psVar20;
  size_t sVar21;
  byte bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  Triangle *local_70;
  
  bVar22 = 0;
  __ptr = (undefined8 *)malloc(0x20);
  *__ptr = bvh_root;
  *(undefined4 *)(__ptr + 2) = 0;
  sVar21 = mesh->triangle_count;
  pvVar7 = malloc(sVar21);
  __ptr[1] = pvVar7;
  __ptr[3] = 0;
  if (sVar21 != 0) {
    memset(pvVar7,1,sVar21);
  }
  local_70 = new_triangles;
  do {
    puVar12 = (undefined8 *)__ptr[3];
    pfVar2 = (float *)*__ptr;
    lVar3 = __ptr[1];
    pfVar2[0] = INFINITY;
    pfVar2[1] = INFINITY;
    pfVar2[2] = INFINITY;
    pfVar2[3] = -INFINITY;
    pfVar2[4] = -INFINITY;
    pfVar2[5] = -INFINITY;
    sVar21 = mesh->triangle_count;
    uVar17 = 0;
    if (sVar21 != 0) {
      lVar8 = 0;
      uVar17 = 0;
      sVar13 = 0;
      do {
        if (*(char *)(lVar3 + sVar13) == '\x01') {
          fVar23 = *pfVar2;
          fVar24 = pfVar2[1];
          fVar25 = pfVar2[3];
          fVar26 = pfVar2[4];
          fVar27 = pfVar2[2];
          fVar28 = pfVar2[5];
          pTVar4 = mesh->triangles;
          lVar15 = 8;
          do {
            fVar1 = *(float *)((long)pTVar4->vertices + lVar15 + lVar8 + -8);
            if (fVar1 < fVar23) {
              *pfVar2 = fVar1;
              fVar23 = fVar1;
            }
            fVar1 = *(float *)((long)pTVar4->vertices + lVar15 + lVar8 + -8);
            if (fVar25 < fVar1) {
              pfVar2[3] = fVar1;
              fVar25 = fVar1;
            }
            fVar1 = *(float *)((long)pTVar4->vertices + lVar15 + lVar8 + -4);
            if (fVar1 < fVar24) {
              pfVar2[1] = fVar1;
              fVar24 = fVar1;
            }
            fVar1 = *(float *)((long)pTVar4->vertices + lVar15 + lVar8 + -4);
            if (fVar26 < fVar1) {
              pfVar2[4] = fVar1;
              fVar26 = fVar1;
            }
            fVar1 = *(float *)((long)&pTVar4->vertices[0].x + lVar15 + lVar8);
            if (fVar1 < fVar27) {
              pfVar2[2] = fVar1;
              fVar27 = fVar1;
            }
            fVar1 = *(float *)((long)&pTVar4->vertices[0].x + lVar15 + lVar8);
            if (fVar28 < fVar1) {
              pfVar2[5] = fVar1;
              fVar28 = fVar1;
            }
            lVar15 = lVar15 + 0xc;
          } while (lVar15 != 0x2c);
          uVar17 = uVar17 + 1;
        }
        sVar13 = sVar13 + 1;
        lVar8 = lVar8 + 0x48;
      } while (sVar13 != sVar21);
    }
    *(bool *)(pfVar2 + 6) = (int)uVar17 < 6 || 0x13 < depth;
    if ((int)uVar17 < 6 || 0x13 < depth) {
      *(Triangle **)(pfVar2 + 8) = local_70;
      pfVar2[10] = 0.0;
      if (mesh->triangle_count != 0) {
        lVar8 = 0;
        uVar14 = 0;
        do {
          if (*(char *)(lVar3 + uVar14) == '\x01') {
            fVar23 = pfVar2[10];
            pfVar2[10] = (float)((int)fVar23 + 1);
            puVar16 = (undefined4 *)((long)&mesh->triangles->vertices[0].x + lVar8);
            puVar18 = (undefined4 *)((long)(int)fVar23 * 0x48 + *(long *)(pfVar2 + 8));
            for (lVar15 = 0x12; lVar15 != 0; lVar15 = lVar15 + -1) {
              *puVar18 = *puVar16;
              puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
              puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
            }
          }
          uVar14 = uVar14 + 1;
          lVar8 = lVar8 + 0x48;
        } while (uVar14 < mesh->triangle_count);
      }
      local_70 = local_70 + (int)pfVar2[10];
    }
    else {
      pCVar19 = centroids_by_x;
      if ((*(uint *)(__ptr + 2) % 3 != 0) &&
         (pCVar19 = centroids_by_z, *(uint *)(__ptr + 2) % 3 != 2)) {
        pCVar19 = centroids_by_y;
      }
      pvVar7 = malloc(sVar21);
      pvVar9 = malloc(sVar21);
      if (sVar21 != 0) {
        psVar20 = &pCVar19->idx;
        iVar6 = 0;
        do {
          sVar5 = *psVar20;
          *(undefined1 *)((long)pvVar7 + sVar5) = 0;
          *(undefined1 *)((long)pvVar9 + sVar5) = 0;
          if (*(char *)(lVar3 + sVar5) == '\x01') {
            pvVar10 = pvVar9;
            if (iVar6 < (int)(uVar17 >> 1)) {
              pvVar10 = pvVar7;
            }
            *(undefined1 *)(sVar5 + (long)pvVar10) = 1;
            iVar6 = iVar6 + 1;
          }
          psVar20 = psVar20 + 3;
          sVar21 = sVar21 - 1;
        } while (sVar21 != 0);
      }
      pvVar10 = malloc(0x30);
      *(void **)(pfVar2 + 8) = pvVar10;
      pvVar10 = malloc(0x30);
      *(void **)(pfVar2 + 10) = pvVar10;
      puVar11 = (undefined8 *)malloc(0x20);
      *puVar11 = pvVar10;
      puVar11[1] = pvVar9;
      *(int *)(puVar11 + 2) = *(int *)(__ptr + 2) + 1;
      puVar11[3] = puVar12;
      puVar12 = (undefined8 *)malloc(0x20);
      *puVar12 = *(undefined8 *)(pfVar2 + 8);
      puVar12[1] = pvVar7;
      *(int *)(puVar12 + 2) = *(int *)(__ptr + 2) + 1;
      puVar12[3] = puVar11;
    }
    free((void *)__ptr[1]);
    free(__ptr);
    __ptr = puVar12;
  } while (puVar12 != (undefined8 *)0x0);
  return;
}

Assistant:

void build_bvh_tree(BVHNode* bvh_root, TriangleMesh* mesh,
                    Centroid* centroids_by_x, Centroid* centroids_by_y, Centroid* centroids_by_z,
                    unsigned int depth, Triangle* new_triangles) {
    BVHBuildStackNode* stack_head = malloc(sizeof(BVHBuildStackNode));

    stack_head->bvh_node = bvh_root;
    stack_head->depth = 0;
    stack_head->indices = malloc(sizeof(bool) * mesh->triangle_count);
    stack_head->prev = NULL;

    for (size_t i = 0; i < mesh->triangle_count; i++) {
        stack_head->indices[i] = true;
    }

    while (stack_head) {
        // pop topmost node
        BVHBuildStackNode* current = stack_head;
        stack_head = stack_head->prev;

        BVHNode* node = current->bvh_node;
        bool* indices = current->indices;

        // compute bounding box for current node
        node->vmin.x = INFINITY;
        node->vmin.y = INFINITY;
        node->vmin.z = INFINITY;

        node->vmax.x = -INFINITY;
        node->vmax.y = -INFINITY;
        node->vmax.z = -INFINITY;
        
        int triangle_count = 0;

        for (size_t i = 0; i < mesh->triangle_count; i++) {
            if (indices[i]) {
                for (int j = 0; j < 3; j++) {
                    if (mesh->triangles[i].vertices[j].x < node->vmin.x) {
                        node->vmin.x = mesh->triangles[i].vertices[j].x;
                    }
                    if (mesh->triangles[i].vertices[j].x > node->vmax.x) {
                        node->vmax.x = mesh->triangles[i].vertices[j].x;
                    }

                    if (mesh->triangles[i].vertices[j].y < node->vmin.y) {
                        node->vmin.y = mesh->triangles[i].vertices[j].y;
                    }
                    if (mesh->triangles[i].vertices[j].y > node->vmax.y) {
                        node->vmax.y = mesh->triangles[i].vertices[j].y;
                    }

                    if (mesh->triangles[i].vertices[j].z < node->vmin.z) {
                        node->vmin.z = mesh->triangles[i].vertices[j].z;
                    }
                    if (mesh->triangles[i].vertices[j].z > node->vmax.z) {
                        node->vmax.z = mesh->triangles[i].vertices[j].z;
                    }
                }
                triangle_count++;
            }
        }
        
        node->isLeaf = (triangle_count <= 5 || depth >= 20);
        if (node->isLeaf) {
            // base case : store new triangles in the right place in the reordered triangle array
            node->data.triangles.array = new_triangles;
            node->data.triangles.count = 0;
            for (size_t i = 0; i < mesh->triangle_count; i++) {
                if (indices[i]) {
                    node->data.triangles.array[node->data.triangles.count++] = mesh->triangles[i];
                }
            }
            new_triangles += node->data.triangles.count;
        } else {
            Centroid* centroids_by_split_axis = NULL;
            int split_axis = current->depth % 3;
            switch (split_axis) {
            case 0:
                centroids_by_split_axis = centroids_by_x;
                break;
            case 1:
                centroids_by_split_axis = centroids_by_y;
                break;
            case 2:
                centroids_by_split_axis = centroids_by_z;
                break;
            }

            bool* l_indices = malloc(sizeof(bool) * mesh->triangle_count);
            bool* r_indices = malloc(sizeof(bool) * mesh->triangle_count);

            int triangles_seen = 0;
            for (size_t i = 0; i < mesh->triangle_count; i++) {
                size_t idx = centroids_by_split_axis[i].idx;
                l_indices[idx] = false;
                r_indices[idx] = false;
                if (indices[idx]) {
                    if (triangles_seen < triangle_count / 2) {
                        l_indices[idx] = true;
                    } else {
                        r_indices[idx] = true;
                    }
                    triangles_seen++;
                }
            }

            node->data.children.left = malloc(sizeof(BVHNode));
            node->data.children.right = malloc(sizeof(BVHNode));
            
            // push right child on stack
            BVHBuildStackNode* new_stack_element = malloc(sizeof(BVHBuildStackNode));
            new_stack_element->bvh_node = node->data.children.right;
            new_stack_element->indices = r_indices;
            new_stack_element->depth = current->depth + 1;
            
            new_stack_element->prev = stack_head;
            stack_head = new_stack_element;

            // push left child on stack
            new_stack_element = malloc(sizeof(BVHBuildStackNode));
            new_stack_element->bvh_node = node->data.children.left;
            new_stack_element->indices = l_indices;
            new_stack_element->depth = current->depth + 1;
            
            new_stack_element->prev = stack_head;
            stack_head = new_stack_element;
        }
        // cleanup
        free(current->indices);
        free(current);
    }
}